

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builtin_kernel.cxx
# Opt level: O3

void ExchCXX::detail::host_eval_exc_vxc_inc_helper_unpolar<ExchCXX::BuiltinR2SCANL_X>
               (double scal_fact,int N,const_host_buffer_type rho,const_host_buffer_type sigma,
               const_host_buffer_type lapl,const_host_buffer_type tau,host_buffer_type eps,
               host_buffer_type vrho,host_buffer_type vsigma,host_buffer_type vlapl,
               host_buffer_type vtau)

{
  ulong uVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double rho_00;
  double e;
  double local_b8;
  double local_b0;
  double local_a8;
  double local_a0;
  double local_98;
  double local_90;
  const_host_buffer_type local_88;
  const_host_buffer_type local_80;
  const_host_buffer_type local_78;
  double local_70;
  double local_68;
  double local_60;
  double local_58;
  double local_50;
  double local_48;
  double local_40;
  double local_38;
  
  if (0 < N) {
    local_90 = scal_fact * 0.0;
    uVar1 = 0;
    local_88 = rho;
    local_80 = sigma;
    local_78 = lapl;
    do {
      local_68 = local_78[uVar1];
      rho_00 = local_88[uVar1];
      local_70 = local_80[uVar1];
      if (rho_00 <= 1e-15) {
        local_a8 = 0.0;
        local_b0 = 0.0;
        local_b8 = 0.0;
        local_40 = 0.0;
        local_a0 = 0.0;
      }
      else {
        dVar2 = 1.0000000000000052e-40;
        if (1.0000000000000052e-40 <= local_70) {
          dVar2 = local_70;
        }
        local_98 = rho_00;
        kernel_traits<ExchCXX::BuiltinPC07OPT_K>::eval_exc_vxc_unpolar_impl
                  (rho_00,dVar2,local_68,0.0,&local_a0,&local_a8,&local_b0,&local_b8,&local_40);
        rho_00 = local_98;
      }
      local_a0 = local_a0 * rho_00;
      dVar2 = 0.0;
      dVar4 = 0.0;
      dVar3 = 0.0;
      dVar5 = 0.0;
      if (1e-11 < rho_00) {
        dVar2 = 4.641588833612795e-30;
        if (4.641588833612795e-30 <= local_70) {
          dVar2 = local_70;
        }
        dVar4 = 1e-20;
        if (1e-20 <= local_a0) {
          dVar4 = local_a0;
        }
        dVar3 = rho_00 * 8.0 * dVar4;
        if (dVar2 <= dVar3) {
          dVar3 = dVar2;
        }
        kernel_traits<ExchCXX::BuiltinR2SCAN_X>::eval_exc_vxc_unpolar_impl
                  (rho_00,dVar3,local_68,dVar4,&local_48,&local_50,&local_58,&local_38,&local_60);
        dVar2 = local_60;
        dVar4 = local_48;
        dVar3 = local_58;
        dVar5 = local_50;
      }
      eps[uVar1] = dVar4 * scal_fact + eps[uVar1];
      vrho[uVar1] = (local_a8 * dVar2 + dVar5) * scal_fact + vrho[uVar1];
      vsigma[uVar1] = (local_b0 * dVar2 + dVar3) * scal_fact + vsigma[uVar1];
      vtau[uVar1] = vtau[uVar1] + local_90;
      vlapl[uVar1] = dVar2 * local_b8 * scal_fact + vlapl[uVar1];
      uVar1 = uVar1 + 1;
    } while ((uint)N != uVar1);
  }
  return;
}

Assistant:

MGGA_EXC_VXC_INC_GENERATOR( host_eval_exc_vxc_inc_helper_unpolar ) {

  using traits = kernel_traits<KernelType>;
  
  for( int32_t i = 0; i < N; ++i ) {

    const auto lapl_i = traits::needs_laplacian ? lapl[i] : 0.0;
    double e, vr, vs, vl, vt;
    
    traits::eval_exc_vxc_unpolar( rho[i], sigma[i], lapl_i, tau[i], 
      e, vr, vs, vl, vt );
    eps[i]    += scal_fact * e;
    vrho[i]   += scal_fact * vr;
    vsigma[i] += scal_fact * vs;
    vtau[i]   += scal_fact * vt;
    if(traits::needs_laplacian) vlapl[i] += scal_fact * vl;

  }


}